

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void measureAllocationSize(sqlite3 *db,void *p)

{
  int iVar1;
  long in_RDI;
  sqlite3 *in_stack_ffffffffffffffe8;
  
  iVar1 = sqlite3DbMallocSize(in_stack_ffffffffffffffe8,(void *)0x1527dd);
  **(int **)(in_RDI + 0x300) = iVar1 + **(int **)(in_RDI + 0x300);
  return;
}

Assistant:

static SQLITE_NOINLINE void measureAllocationSize(sqlite3 *db, void *p){
  *db->pnBytesFreed += sqlite3DbMallocSize(db,p);
}